

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.cpp
# Opt level: O1

bool canConvertMetaObject(QMetaType fromType,QMetaType toType)

{
  bool bVar1;
  uint uVar2;
  QMetaObject *this;
  QMetaObject *metaObject;
  uint uVar3;
  
  uVar2 = 0;
  uVar3 = 0;
  if (fromType.d_ptr != (QMetaTypeInterface *)0x0) {
    uVar3 = (fromType.d_ptr)->flags & 0x800;
  }
  if (toType.d_ptr != (QMetaTypeInterface *)0x0) {
    uVar2 = (toType.d_ptr)->flags & 0x800;
  }
  if (uVar3 == uVar2) {
    if ((fromType.d_ptr == (QMetaTypeInterface *)0x0) ||
       ((fromType.d_ptr)->metaObjectFn == (MetaObjectFn)0x0)) {
      this = (QMetaObject *)0x0;
    }
    else {
      this = (*(fromType.d_ptr)->metaObjectFn)(fromType.d_ptr);
    }
    if ((toType.d_ptr == (QMetaTypeInterface *)0x0) ||
       ((toType.d_ptr)->metaObjectFn == (MetaObjectFn)0x0)) {
      metaObject = (QMetaObject *)0x0;
    }
    else {
      metaObject = (*(toType.d_ptr)->metaObjectFn)(toType.d_ptr);
    }
    if (metaObject != (QMetaObject *)0x0 && this != (QMetaObject *)0x0) {
      bVar1 = QMetaObject::inherits(this,metaObject);
      if (bVar1) {
        return true;
      }
      bVar1 = QMetaObject::inherits(metaObject,this);
      return bVar1;
    }
  }
  return false;
}

Assistant:

static bool canConvertMetaObject(QMetaType fromType, QMetaType toType)
{
    if ((fromType.flags() & QMetaType::IsPointer) != (toType.flags() & QMetaType::IsPointer))
        return false; // Can not convert between pointer and value

    const QMetaObject *f = fromType.metaObject();
    const QMetaObject *t = toType.metaObject();
    if (f && t) {
        return f->inherits(t) || (t->inherits(f));
    }
    return false;
}